

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::DataSink::DataSink(DataSink *this)

{
  (this->is_writable).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->is_writable)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->is_writable).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->is_writable).super__Function_base._M_functor + 8) = 0;
  (this->done).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->done)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->done).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->done).super__Function_base._M_functor + 8) = 0;
  (this->write).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->write)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->write).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->write).super__Function_base._M_functor + 8) = 0;
  std::ostream::ostream(&this->os,&(this->sb_).super_streambuf);
  *(code **)&this->sb_ = std::_Rb_tree_increment;
  *(undefined8 *)&(this->sb_).field_0x8 = 0;
  *(undefined8 *)&(this->sb_).field_0x10 = 0;
  *(undefined8 *)&(this->sb_).field_0x18 = 0;
  *(undefined8 *)&(this->sb_).field_0x20 = 0;
  *(undefined8 *)&(this->sb_).field_0x28 = 0;
  *(undefined8 *)&(this->sb_).field_0x30 = 0;
  std::locale::locale((locale *)&(this->sb_).field_0x38);
  *(undefined ***)&this->sb_ = &PTR__streambuf_00237bd8;
  (this->sb_).sink_ = this;
  return;
}

Assistant:

DataSink() : os(&sb_), sb_(*this) {}